

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dspsubrs.c
# Opt level: O0

void DSP_showdisplay(LispPTR *args)

{
  LispPTR rasterwidth;
  LispPTR base;
  LispPTR *args_local;
  
  DisplayInitialized = (int)(*args != 0);
  return;
}

Assistant:

void DSP_showdisplay(LispPTR *args)
{
  LispPTR base = args[0];   /* pointer to the display bitmap */
  LispPTR rasterwidth = args[1];  /* should be a smallp */

  if (base == NIL) {
    DisplayInitialized = 0;
  } else {
    DisplayInitialized = 1;
  }
}